

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum.cpp
# Opt level: O0

void __thiscall Timidity::ToneBank::~ToneBank(ToneBank *this)

{
  ToneBankElement *pTVar1;
  long lVar2;
  Instrument *this_00;
  ToneBankElement *this_01;
  int local_14;
  int i;
  ToneBank *this_local;
  
  pTVar1 = this->tone;
  if (pTVar1 != (ToneBankElement *)0x0) {
    lVar2 = *(long *)&pTVar1[-1].fontnote;
    this_01 = pTVar1 + lVar2;
    while (pTVar1 != this_01) {
      this_01 = this_01 + -1;
      ToneBankElement::~ToneBankElement(this_01);
    }
    operator_delete__(&pTVar1[-1].fontnote,lVar2 * 0x20 + 8);
  }
  for (local_14 = 0; local_14 < 0x80; local_14 = local_14 + 1) {
    if ((this->instrument[local_14] != (Instrument *)0x0) &&
       (this->instrument[local_14] != (Instrument *)0xffffffffffffffff)) {
      this_00 = this->instrument[local_14];
      if (this_00 != (Instrument *)0x0) {
        Instrument::~Instrument(this_00);
        operator_delete(this_00,0x10);
      }
      this->instrument[local_14] = (Instrument *)0x0;
    }
  }
  return;
}

Assistant:

ToneBank::~ToneBank()
{
	delete[] tone;
	for (int i = 0; i < MAXPROG; i++)
	{
		if (instrument[i] != NULL && instrument[i] != MAGIC_LOAD_INSTRUMENT)
		{
			delete instrument[i];
			instrument[i] = NULL;
		}
	}
}